

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O0

MessageBase * __thiscall MessageQueue::PopAndWait(MessageQueue *this)

{
  bool bVar1;
  uint uVar2;
  DWORD DVar3;
  PAL_FILE *pPVar4;
  ListEntry LVar5;
  int waitTime;
  MessageBase *tmp;
  ListEntry entry;
  MessageQueue *this_local;
  
  bVar1 = SortedList<MessageQueue::ListEntry>::IsEmpty(&this->m_queue);
  if (bVar1) {
    pPVar4 = PAL_get_stderr(0);
    PAL_fprintf(pPVar4,"ASSERTION (%s, line %d) %s %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/MessageQueue.h"
                ,0xcd,"!m_queue.IsEmpty()");
    pPVar4 = PAL_get_stderr(0);
    PAL_fflush(pPVar4);
    DebugBreak();
  }
  LVar5 = SortedList<MessageQueue::ListEntry>::Pop(&this->m_queue);
  uVar2 = MessageBase::GetTime(LVar5.message);
  DVar3 = GetTickCount();
  if (0 < (int)(uVar2 - DVar3)) {
    Sleep(uVar2 - DVar3);
  }
  return LVar5.message;
}

Assistant:

MessageBase* PopAndWait()
    {
        Assert(!m_queue.IsEmpty());

        ListEntry entry = m_queue.Pop();
        MessageBase *tmp = entry.message;

        int waitTime = tmp->GetTime() - GetTickCount();
        if(waitTime > 0)
        {
            Sleep(waitTime);
        }

        return tmp;
    }